

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

HANDLE CreateThread(LPSECURITY_ATTRIBUTES lpThreadAttributes,DWORD dwStackSize,
                   LPTHREAD_START_ROUTINE lpStartAddress,LPVOID lpParameter,DWORD dwCreationFlags,
                   LPDWORD lpThreadId)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  SIZE_T local_48;
  SIZE_T osThreadId;
  HANDLE local_38;
  HANDLE hNewThread;
  
  local_38 = (HANDLE)0x0;
  osThreadId = (SIZE_T)lpThreadId;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    local_48 = 0;
    PVar1 = CorUnix::InternalCreateThread
                      (pThread,lpThreadAttributes,dwStackSize,lpStartAddress,lpParameter,
                       dwCreationFlags,UserCreatedThread,&local_48,&local_38);
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    if (osThreadId != 0) {
      *(undefined4 *)osThreadId = (undefined4)local_48;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return local_38;
    }
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateThread(
    IN LPSECURITY_ATTRIBUTES lpThreadAttributes,
    IN DWORD dwStackSize,
    IN LPTHREAD_START_ROUTINE lpStartAddress,
    IN LPVOID lpParameter,
    IN DWORD dwCreationFlags,
    OUT LPDWORD lpThreadId)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    HANDLE hNewThread = NULL;

    PERF_ENTRY(CreateThread);
    ENTRY("CreateThread(lpThreadAttr=%p, dwStackSize=%u, lpStartAddress=%p, "
          "lpParameter=%p, dwFlags=%#x, lpThreadId=%#x)\n",
          lpThreadAttributes, dwStackSize, lpStartAddress, lpParameter,
          dwCreationFlags, lpThreadId);

    pThread = InternalGetCurrentThread();

    SIZE_T osThreadId = 0;
    palError = InternalCreateThread(
        pThread,
        lpThreadAttributes,
        dwStackSize,
        lpStartAddress,
        lpParameter,
        dwCreationFlags,
        UserCreatedThread,
        &osThreadId,
        &hNewThread
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    if(lpThreadId != nullptr)
    {
        *lpThreadId = osThreadId;
    }
    LOGEXIT("CreateThread returns HANDLE %p\n", hNewThread);
    PERF_EXIT(CreateThread);

    return hNewThread;
}